

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateSymbolImports
          (EnumGenerator *this,Printer *printer)

{
  bool bVar1;
  EnumValueDescriptor *d;
  EnumValueDescriptor *enum_value;
  long lVar2;
  long lVar3;
  Formatter format;
  string deprecated_attr;
  cpp *local_b0;
  Formatter local_a8;
  string local_70;
  string local_50;
  
  local_a8.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_a8.vars_._M_t,&(this->variables_)._M_t);
  Formatter::operator()<>(&local_a8,"typedef $classname$ $resolved_name$;\n");
  lVar3 = 0;
  lVar2 = 0;
  while( true ) {
    d = (EnumValueDescriptor *)(long)*(int *)(this->descriptor_ + 4);
    if ((long)d <= lVar2) break;
    DeprecatedAttribute_abi_cxx11_
              (&local_50,(cpp *)this->options_,
               (Options *)(*(long *)(this->descriptor_ + 0x28) + lVar3),d);
    local_b0 = (cpp *)(*(long *)(this->descriptor_ + 0x28) + lVar3);
    EnumValueName_abi_cxx11_(&local_70,local_b0,enum_value);
    Formatter::operator()
              (&local_a8,"$1$static constexpr $resolved_name$ ${2$$3$$}$ =\n  $classname$_$3$;\n",
               &local_50,(EnumValueDescriptor **)&local_b0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x20;
  }
  Formatter::operator()
            (&local_a8,
             "static inline bool $nested_name$_IsValid(int value) {\n  return $classname$_IsValid(value);\n}\nstatic constexpr $resolved_name$ ${1$$nested_name$_MIN$}$ =\n  $classname$_$nested_name$_MIN;\nstatic constexpr $resolved_name$ ${1$$nested_name$_MAX$}$ =\n  $classname$_$nested_name$_MAX;\n"
             ,&this->descriptor_);
  if (this->generate_array_size_ == true) {
    Formatter::operator()
              (&local_a8,
               "static constexpr int ${1$$nested_name$_ARRAYSIZE$}$ =\n  $classname$_$nested_name$_ARRAYSIZE;\n"
               ,&this->descriptor_);
  }
  bVar1 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
  if (bVar1) {
    Formatter::operator()<>
              (&local_a8,
               "static inline const ::$proto_ns$::EnumDescriptor*\n$nested_name$_descriptor() {\n  return $classname$_descriptor();\n}\n"
              );
  }
  Formatter::operator()<>
            (&local_a8,
             "template<typename T>\nstatic inline const std::string& $nested_name$_Name(T enum_t_value) {\n  static_assert(::std::is_same<T, $resolved_name$>::value ||\n    ::std::is_integral<T>::value,\n    \"Incorrect type passed to function $nested_name$_Name.\");\n  return $classname$_Name(enum_t_value);\n}\n"
            );
  Formatter::operator()<>
            (&local_a8,
             "static inline bool $nested_name$_Parse(::PROTOBUF_NAMESPACE_ID::ConstStringParam name,\n    $resolved_name$* value) {\n  return $classname$_Parse(name, value);\n}\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8.vars_._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateSymbolImports(io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("typedef $classname$ $resolved_name$;\n");

  for (int j = 0; j < descriptor_->value_count(); j++) {
    std::string deprecated_attr =
        DeprecatedAttribute(options_, descriptor_->value(j));
    format(
        "$1$static constexpr $resolved_name$ ${2$$3$$}$ =\n"
        "  $classname$_$3$;\n",
        deprecated_attr, descriptor_->value(j),
        EnumValueName(descriptor_->value(j)));
  }

  format(
      "static inline bool $nested_name$_IsValid(int value) {\n"
      "  return $classname$_IsValid(value);\n"
      "}\n"
      "static constexpr $resolved_name$ ${1$$nested_name$_MIN$}$ =\n"
      "  $classname$_$nested_name$_MIN;\n"
      "static constexpr $resolved_name$ ${1$$nested_name$_MAX$}$ =\n"
      "  $classname$_$nested_name$_MAX;\n",
      descriptor_);
  if (generate_array_size_) {
    format(
        "static constexpr int ${1$$nested_name$_ARRAYSIZE$}$ =\n"
        "  $classname$_$nested_name$_ARRAYSIZE;\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "static inline const ::$proto_ns$::EnumDescriptor*\n"
        "$nested_name$_descriptor() {\n"
        "  return $classname$_descriptor();\n"
        "}\n");
  }

  format(
      "template<typename T>\n"
      "static inline const std::string& $nested_name$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $resolved_name$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $nested_name$_Name.\");\n"
      "  return $classname$_Name(enum_t_value);\n"
      "}\n");
  format(
      "static inline bool "
      "$nested_name$_Parse(::PROTOBUF_NAMESPACE_ID::ConstStringParam name,\n"
      "    $resolved_name$* value) {\n"
      "  return $classname$_Parse(name, value);\n"
      "}\n");
}